

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono.h
# Opt level: O0

ssize_t __thiscall
fmt::v5::internal::
chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
::write(chrono_formatter<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>,_std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>_>
        *this,int __fd,void *__buf,size_t __n)

{
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *pbVar1;
  type n_00;
  int iVar2;
  back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_> bVar3;
  int num_digits;
  main_type n;
  back_insert_iterator<fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>_>
  in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffe0;
  int __n_00;
  
  __n_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  n_00 = to_unsigned<int>(__fd);
  iVar2 = count_digits(n_00);
  if (iVar2 < (int)__buf) {
    bVar3.container._4_4_ = n_00;
    bVar3.container._0_4_ = iVar2;
    bVar3 = std::
            fill_n<std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,500ul,std::allocator<char>>>,int,char>
                      (bVar3,__n_00,(this->out).container);
    (this->out).container = bVar3.container;
  }
  pbVar1 = (this->out).container;
  bVar3 = format_decimal<char,std::back_insert_iterator<fmt::v5::basic_memory_buffer<char,500ul,std::allocator<char>>>,unsigned_int>
                    (in_stack_ffffffffffffffc8,(uint)((ulong)pbVar1 >> 0x20),(int)pbVar1);
  (this->out).container = bVar3.container;
  return (ssize_t)this;
}

Assistant:

void write(int value, int width) {
    typedef typename int_traits<int>::main_type main_type;
    main_type n = to_unsigned(value);
    int num_digits = internal::count_digits(n);
    if (width > num_digits)
      out = std::fill_n(out, width - num_digits, '0');
    out = format_decimal<char_type>(out, n, num_digits);
  }